

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::reportInvalidArguments(ConsoleReporter *this,string *arg)

{
  ostream *poVar1;
  string *arg_local;
  ConsoleReporter *this_local;
  
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           "Invalid Filter: ");
  poVar1 = std::operator<<(poVar1,(string *)arg);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ConsoleReporter::reportInvalidArguments(std::string const &arg) {
    stream << "Invalid Filter: " << arg << std::endl;
  }